

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

void __thiscall
kj::Vector<kj::(anonymous_namespace)::SocketAddress>::setCapacity
          (Vector<kj::(anonymous_namespace)::SocketAddress> *this,size_t newSize)

{
  ArrayDisposer *pAVar1;
  ArrayBuilder<kj::(anonymous_namespace)::SocketAddress> *pAVar2;
  __off_t __length;
  undefined1 local_38 [8];
  ArrayBuilder<kj::(anonymous_namespace)::SocketAddress> newBuilder;
  size_t newSize_local;
  Vector<kj::(anonymous_namespace)::SocketAddress> *this_local;
  
  newBuilder.disposer = (ArrayDisposer *)newSize;
  pAVar1 = (ArrayDisposer *)
           ArrayBuilder<kj::(anonymous_namespace)::SocketAddress>::size(&this->builder);
  if (newBuilder.disposer < pAVar1) {
    ArrayBuilder<kj::(anonymous_namespace)::SocketAddress>::truncate
              (&this->builder,(char *)newBuilder.disposer,__length);
  }
  heapArrayBuilder<kj::(anonymous_namespace)::SocketAddress>
            ((ArrayBuilder<kj::(anonymous_namespace)::SocketAddress> *)local_38,
             (size_t)newBuilder.disposer);
  pAVar2 = mv<kj::ArrayBuilder<kj::(anonymous_namespace)::SocketAddress>>(&this->builder);
  ArrayBuilder<kj::(anonymous_namespace)::SocketAddress>::
  addAll<kj::ArrayBuilder<kj::(anonymous_namespace)::SocketAddress>>
            ((ArrayBuilder<kj::(anonymous_namespace)::SocketAddress> *)local_38,pAVar2);
  pAVar2 = mv<kj::ArrayBuilder<kj::(anonymous_namespace)::SocketAddress>>
                     ((ArrayBuilder<kj::(anonymous_namespace)::SocketAddress> *)local_38);
  ArrayBuilder<kj::(anonymous_namespace)::SocketAddress>::operator=(&this->builder,pAVar2);
  ArrayBuilder<kj::(anonymous_namespace)::SocketAddress>::~ArrayBuilder
            ((ArrayBuilder<kj::(anonymous_namespace)::SocketAddress> *)local_38);
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }